

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O3

void Assimp::IFC::ConvertDirection(IfcVector3 *out,IfcDirection *in)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  long lVar5;
  ulong uVar6;
  IfcVector3 *pIVar7;
  double dVar8;
  char *unaff_retaddr;
  
  out->x = 0.0;
  out->y = 0.0;
  out->z = 0.0;
  lVar5 = *(long *)&(in->super_IfcGeometricRepresentationItem).field_0x30;
  if (*(long *)&in->field_0x38 != lVar5) {
    uVar6 = 0;
    do {
      pIVar7 = (IfcVector3 *)&out->z;
      if (((int)uVar6 != 2) && (pIVar7 = out, (int)uVar6 == 1)) {
        pIVar7 = (IfcVector3 *)&out->y;
      }
      pIVar7->x = *(double *)(lVar5 + uVar6 * 8);
      uVar6 = uVar6 + 1;
      lVar5 = *(long *)&(in->super_IfcGeometricRepresentationItem).field_0x30;
    } while (uVar6 < (ulong)(*(long *)&in->field_0x38 - lVar5 >> 3));
  }
  dVar3 = out->x;
  dVar4 = out->y;
  dVar1 = out->z;
  dVar8 = SQRT(dVar1 * dVar1 + dVar3 * dVar3 + dVar4 * dVar4);
  if (1e-06 <= dVar8) {
    dVar8 = 1.0 / dVar8;
    auVar2._8_4_ = SUB84(dVar4 * dVar8,0);
    auVar2._0_8_ = dVar3 * dVar8;
    auVar2._12_4_ = (int)((ulong)(dVar4 * dVar8) >> 0x20);
    out->x = dVar3 * dVar8;
    out->y = (double)auVar2._8_8_;
    out->z = dVar1 * dVar8;
    return;
  }
  LogFunctions<Assimp::IFCImporter>::LogWarn(unaff_retaddr);
  return;
}

Assistant:

void ConvertDirection(IfcVector3& out, const Schema_2x3::IfcDirection& in)
{
    out = IfcVector3();
    for(size_t i = 0; i < in.DirectionRatios.size(); ++i) {
        out[static_cast<unsigned int>(i)] = in.DirectionRatios[i];
    }
    const IfcFloat len = out.Length();
    if (len<1e-6) {
        IFCImporter::LogWarn("direction vector magnitude too small, normalization would result in a division by zero");
        return;
    }
    out /= len;
}